

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_i2c_freq(mraa_i2c_context dev,mraa_i2c_mode_t mode)

{
  ssize_t sVar1;
  int local_2c;
  char local_25;
  int length;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char bu [5];
  int sysnode;
  mraa_i2c_mode_t mode_local;
  mraa_i2c_context dev_local;
  
  cStack_20 = -1;
  cStack_1f = -1;
  cStack_1e = -1;
  bu[0] = -1;
  bu._1_4_ = mode;
  if (dev->busnum == 1) {
    _cStack_20 = open("/sys/devices/pci0000:00/0000:00:08.0/i2c_dw_sysnode/mode",2);
  }
  else {
    if (dev->busnum != 6) {
      syslog(5,"i2c bus selected does not support frequency changes");
      return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
    _cStack_20 = open("/sys/devices/pci0000:00/0000:00:09.1/i2c_dw_sysnode/mode",2);
  }
  if (_cStack_20 == -1) {
    dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    if (bu._1_4_ == 0) {
      local_2c = snprintf(&local_25,5,"std");
    }
    else if (bu._1_4_ == 1) {
      local_2c = snprintf(&local_25,5,"fast");
    }
    else {
      if (bu._1_4_ != 2) {
        syslog(3,"Invalid i2c mode selected");
        close(_cStack_20);
        return MRAA_ERROR_INVALID_PARAMETER;
      }
      local_2c = snprintf(&local_25,5,"high");
    }
    sVar1 = write(_cStack_20,&local_25,(long)local_2c);
    if (sVar1 == -1) {
      close(_cStack_20);
      dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      close(_cStack_20);
      dev_local._4_4_ = MRAA_SUCCESS;
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_edison_i2c_freq(mraa_i2c_context dev, mraa_i2c_mode_t mode)
{
    int sysnode = -1;

    switch (dev->busnum) {
        case 1:
            sysnode = open("/sys/devices/pci0000:00/0000:00:08.0/i2c_dw_sysnode/mode", O_RDWR);
            break;
        case 6:
            sysnode = open("/sys/devices/pci0000:00/0000:00:09.1/i2c_dw_sysnode/mode", O_RDWR);
            break;
        default:
            syslog(LOG_NOTICE, "i2c bus selected does not support frequency changes");
            return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
    if (sysnode == -1) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    char bu[5];
    int length;
    switch (mode) {
        case MRAA_I2C_STD:
            length = snprintf(bu, sizeof(bu), "std");
            break;
        case MRAA_I2C_FAST:
            length = snprintf(bu, sizeof(bu), "fast");
            break;
        case MRAA_I2C_HIGH:
            length = snprintf(bu, sizeof(bu), "high");
            break;
        default:
            syslog(LOG_ERR, "Invalid i2c mode selected");
            close(sysnode);
            return MRAA_ERROR_INVALID_PARAMETER;
    }
    if (write(sysnode, bu, length * sizeof(char)) == -1) {
        close(sysnode);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    close(sysnode);
    return MRAA_SUCCESS;
}